

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64-gen.c
# Opt level: O0

int oad(int c,int s)

{
  int t;
  int s_local;
  int c_local;
  
  s_local = s;
  if (nocode_wanted == 0) {
    o(c);
    s_local = ind;
    gen_le32(s);
  }
  return s_local;
}

Assistant:

static int oad(int c, int s) {
  int t;
  if (nocode_wanted)
    return s;
  o(c);
  t = ind;
  gen_le32(s);
  return t;
}